

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_promise_race(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue this_val_00;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue obj_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue method;
  JSValue obj_01;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue v_08;
  JSValue v_09;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue obj_02;
  JSValue obj_03;
  int iVar1;
  undefined4 in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  undefined8 in_R8;
  JSValue JVar2;
  JSValue JVar3;
  JSValue error;
  BOOL done;
  JSValue promise_resolve;
  JSValue iter;
  JSValue next_method;
  JSValue ret;
  JSValue next_promise;
  JSValue item;
  JSValue resolving_funcs [2];
  JSValue result_promise;
  JSValueUnion JVar4;
  JSContext *in_stack_fffffffffffffe00;
  JSContext *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  int64_t in_stack_fffffffffffffe18;
  JSValueUnion local_1e0;
  int argc_00;
  JSValueUnion in_stack_fffffffffffffe30;
  JSValueUnion in_stack_fffffffffffffe38;
  JSValueUnion in_stack_fffffffffffffe40;
  JSValueUnion in_stack_fffffffffffffe48;
  JSValueUnion in_stack_fffffffffffffe50;
  JSValue *in_stack_fffffffffffffe68;
  JSContext *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  JSContext *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  BOOL in_stack_fffffffffffffe8c;
  JSContext *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  BOOL in_stack_fffffffffffffe9c;
  int64_t in_stack_fffffffffffffea0;
  JSValueUnion ctx_00;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  JSValueUnion local_140;
  int64_t local_138;
  undefined1 local_12c [4];
  undefined8 local_128;
  int64_t local_120;
  JSValueUnion local_118;
  JSValueUnion local_110;
  JSValueUnion local_108;
  int64_t local_100;
  JSValueUnion local_f8;
  int64_t local_f0;
  JSValueUnion local_e8;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff4c;
  JSContext *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff70;
  JSValueUnion local_70;
  int64_t local_68;
  JSValueUnion local_40;
  int64_t local_38;
  undefined4 in_stack_fffffffffffffff0;
  int64_t local_8;
  
  local_108.float64 = 0.0;
  local_100 = 3;
  local_118.float64 = 0.0;
  local_110.float64 = 1.48219693752374e-323;
  local_128 = (JSValueUnion)0x0;
  local_120 = 3;
  JVar2.tag = in_RDX;
  JVar2.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar2);
  if (iVar1 == 0) {
    _local_70 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1833ef);
  }
  else {
    JVar3.u._4_4_ = in_stack_fffffffffffffe7c;
    JVar3.u.int32 = in_stack_fffffffffffffe78;
    JVar3.tag = (int64_t)in_stack_fffffffffffffe80;
    JVar2 = js_new_promise_capability(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,JVar3);
    local_140 = JVar2.u;
    local_138 = JVar2.tag;
    iVar1 = JS_IsException(JVar2);
    if (iVar1 == 0) {
      obj_02.tag._0_4_ = in_stack_ffffffffffffff70;
      obj_02.u = (JSValueUnion)in_R8;
      obj_02.tag._4_4_ = in_ECX;
      this_obj_01.tag = local_138;
      this_obj_01.u.ptr = local_140.ptr;
      JVar2 = JS_GetPropertyInternal
                        (in_stack_ffffffffffffff50,obj_02,in_stack_ffffffffffffff4c,this_obj_01,
                         in_stack_fffffffffffffff0);
      JVar6 = JVar2.u;
      local_8 = JVar2.tag;
      local_120 = local_8;
      local_128 = JVar6;
      iVar1 = JS_IsException(JVar2);
      if ((iVar1 == 0) &&
         (obj_00.u._4_4_ = in_stack_fffffffffffffe14, obj_00.u.int32 = in_stack_fffffffffffffe10,
         obj_00.tag = in_stack_fffffffffffffe18,
         iVar1 = check_function(in_stack_fffffffffffffe08,obj_00), iVar1 == 0)) {
        obj_01.u._4_4_ = in_stack_fffffffffffffe9c;
        obj_01.u.int32 = in_stack_fffffffffffffe98;
        obj_01.tag = in_stack_fffffffffffffea0;
        JVar3 = JS_GetIterator(in_stack_fffffffffffffe90,obj_01,in_stack_fffffffffffffe8c);
        ctx_00 = JVar3.u;
        JVar5 = (JSValueUnion)JVar3.tag;
        local_118 = ctx_00;
        local_110 = JVar5;
        iVar1 = JS_IsException(JVar3);
        if (iVar1 == 0) {
          obj_03.tag._0_4_ = in_stack_ffffffffffffff70;
          obj_03.u = (JSValueUnion)in_R8;
          obj_03.tag._4_4_ = in_ECX;
          this_obj_02.tag = local_138;
          this_obj_02.u.float64 = local_140.float64;
          JVar2 = JS_GetPropertyInternal
                            (in_stack_ffffffffffffff50,obj_03,in_stack_ffffffffffffff4c,this_obj_02,
                             JVar2.u._0_4_);
          local_40 = JVar2.u;
          local_38 = JVar2.tag;
          local_108.float64 = local_40.float64;
          local_100 = local_38;
          iVar1 = JS_IsException(JVar2);
          in_stack_fffffffffffffe50 = local_40;
          if (iVar1 == 0) {
            do {
              in_stack_fffffffffffffe00 = (JSContext *)local_12c;
              enum_obj.u._4_4_ = in_stack_fffffffffffffe9c;
              enum_obj.u.int32 = in_stack_fffffffffffffe98;
              enum_obj.tag = (int64_t)ctx_00.ptr;
              method.u._4_4_ = in_stack_fffffffffffffe8c;
              method.u.int32 = in_stack_fffffffffffffe88;
              method.tag = (int64_t)in_stack_fffffffffffffe90;
              JVar2 = JS_IteratorNext(in_stack_fffffffffffffe80,enum_obj,method,
                                      in_stack_fffffffffffffe7c,
                                      (JSValue *)in_stack_ffffffffffffff20.ptr,
                                      (BOOL *)in_stack_ffffffffffffff28.ptr);
              in_stack_fffffffffffffe40 = JVar2.u;
              in_stack_fffffffffffffe48 = (JSValueUnion)JVar2.tag;
              in_stack_ffffffffffffff28 = in_stack_fffffffffffffe40;
              iVar1 = JS_IsException(JVar2);
              if (iVar1 != 0) goto LAB_00183602;
              if (local_12c != (undefined1  [4])0x0) goto LAB_001839c4;
              JVar4.ptr = &stack0xffffffffffffff28;
              func_obj_00.tag = (int64_t)in_stack_fffffffffffffe50.ptr;
              func_obj_00.u.ptr = in_stack_fffffffffffffe48.ptr;
              this_obj_00.tag = (int64_t)in_stack_fffffffffffffe40.ptr;
              this_obj_00.u.ptr = in_stack_fffffffffffffe38.ptr;
              JVar2 = JS_Call((JSContext *)in_stack_fffffffffffffe30.ptr,func_obj_00,this_obj_00,
                              argc_00,(JSValue *)in_stack_fffffffffffffe70);
              in_stack_fffffffffffffe30 = JVar2.u;
              in_stack_fffffffffffffe38 = (JSValueUnion)JVar2.tag;
              v_01.tag._0_4_ = in_stack_fffffffffffffe10;
              v_01.u.ptr = in_stack_fffffffffffffe08;
              v_01.tag._4_4_ = in_stack_fffffffffffffe14;
              local_e8 = in_stack_fffffffffffffe30;
              in_stack_ffffffffffffff20 = in_stack_fffffffffffffe38;
              JS_FreeValue(in_stack_fffffffffffffe00,v_01);
              v_09.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
              v_09.u.float64 = local_e8.float64;
              iVar1 = JS_IsException(v_09);
              if (iVar1 != 0) break;
              this_val_00.tag._0_4_ = in_stack_fffffffffffffe10;
              this_val_00.u.ptr = in_stack_fffffffffffffe08;
              this_val_00.tag._4_4_ = in_stack_fffffffffffffe14;
              _local_1e0 = JS_InvokeFree(in_stack_fffffffffffffe00,this_val_00,JVar4._4_4_,
                                         JVar4.int32,(JSValue *)0x183970);
              local_f8 = local_1e0;
              obj.tag = (int64_t)in_stack_fffffffffffffe00;
              obj.u.float64 = JVar4.float64;
              local_f0 = local_1e0;
              iVar1 = check_exception_free((JSContext *)0x1839b1,obj);
            } while (iVar1 == 0);
            enum_obj_00.tag = (int64_t)JVar6.ptr;
            enum_obj_00.u.float64 = JVar5.float64;
            JS_IteratorClose((JSContext *)ctx_00.ptr,enum_obj_00,in_stack_fffffffffffffe9c);
          }
        }
      }
LAB_00183602:
      JS_GetException(in_RDI);
      func_obj.tag = (int64_t)in_stack_fffffffffffffe50.ptr;
      func_obj.u.float64 = in_stack_fffffffffffffe48.float64;
      this_obj.tag = (int64_t)in_stack_fffffffffffffe40.ptr;
      this_obj.u.float64 = in_stack_fffffffffffffe38.float64;
      JVar2 = JS_Call((JSContext *)in_stack_fffffffffffffe30.ptr,func_obj,this_obj,argc_00,
                      (JSValue *)in_stack_fffffffffffffe70);
      local_f8 = JVar2.u;
      local_f0 = JVar2.tag;
      v.tag._0_4_ = in_stack_fffffffffffffe10;
      v.u.ptr = in_stack_fffffffffffffe08;
      v.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v);
      v_08.tag = local_f0;
      v_08.u.float64 = local_f8.float64;
      iVar1 = JS_IsException(v_08);
      if (iVar1 == 0) {
        v_00.tag._0_4_ = in_stack_fffffffffffffe10;
        v_00.u.ptr = in_stack_fffffffffffffe08;
        v_00.tag._4_4_ = in_stack_fffffffffffffe14;
        JS_FreeValue(in_stack_fffffffffffffe00,v_00);
      }
      else {
        v_07.tag._0_4_ = in_stack_fffffffffffffe10;
        v_07.u.ptr = in_stack_fffffffffffffe08;
        v_07.tag._4_4_ = in_stack_fffffffffffffe14;
        JS_FreeValue(in_stack_fffffffffffffe00,v_07);
        in_stack_fffffffffffffe10 = 0;
        local_140.ptr = (void *)((ulong)in_stack_fffffffffffffe14 << 0x20);
        local_138 = 6;
      }
LAB_001839c4:
      v_02.tag._0_4_ = in_stack_fffffffffffffe10;
      v_02.u.ptr = in_stack_fffffffffffffe08;
      v_02.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v_02);
      v_03.tag._0_4_ = in_stack_fffffffffffffe10;
      v_03.u.ptr = in_stack_fffffffffffffe08;
      v_03.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v_03);
      v_04.tag._0_4_ = in_stack_fffffffffffffe10;
      v_04.u.ptr = in_stack_fffffffffffffe08;
      v_04.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v_04);
      v_05.tag._0_4_ = in_stack_fffffffffffffe10;
      v_05.u.ptr = in_stack_fffffffffffffe08;
      v_05.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v_05);
      v_06.tag._0_4_ = in_stack_fffffffffffffe10;
      v_06.u.ptr = in_stack_fffffffffffffe08;
      v_06.tag._4_4_ = in_stack_fffffffffffffe14;
      JS_FreeValue(in_stack_fffffffffffffe00,v_06);
      local_68 = local_138;
      local_70.float64 = local_140.float64;
    }
    else {
      local_68 = local_138;
      local_70.ptr = local_140.ptr;
    }
  }
  return _local_70;
}

Assistant:

static JSValue js_promise_race(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv)
{
    JSValue result_promise, resolving_funcs[2], item, next_promise, ret;
    JSValue next_method = JS_UNDEFINED, iter = JS_UNDEFINED;
    JSValue promise_resolve = JS_UNDEFINED;
    BOOL done;

    if (!JS_IsObject(this_val))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    result_promise = js_new_promise_capability(ctx, resolving_funcs, this_val);
    if (JS_IsException(result_promise))
        return result_promise;
    promise_resolve = JS_GetProperty(ctx, this_val, JS_ATOM_resolve);
    if (JS_IsException(promise_resolve) ||
        check_function(ctx, promise_resolve))
        goto fail_reject;
    iter = JS_GetIterator(ctx, argv[0], FALSE);
    if (JS_IsException(iter)) {
        JSValue error;
    fail_reject:
        error = JS_GetException(ctx);
        ret = JS_Call(ctx, resolving_funcs[1], JS_UNDEFINED, 1,
                       (JSValueConst *)&error);
        JS_FreeValue(ctx, error);
        if (JS_IsException(ret))
            goto fail;
        JS_FreeValue(ctx, ret);
    } else {
        next_method = JS_GetProperty(ctx, iter, JS_ATOM_next);
        if (JS_IsException(next_method))
            goto fail_reject;

        for(;;) {
            /* XXX: conformance: should close the iterator if error on 'done'
               access, but not on 'value' access */
            item = JS_IteratorNext(ctx, iter, next_method, 0, NULL, &done);
            if (JS_IsException(item))
                goto fail_reject;
            if (done)
                break;
            next_promise = JS_Call(ctx, promise_resolve,
                                   this_val, 1, (JSValueConst *)&item);
            JS_FreeValue(ctx, item);
            if (JS_IsException(next_promise)) {
            fail_reject1:
                JS_IteratorClose(ctx, iter, TRUE);
                goto fail_reject;
            }
            ret = JS_InvokeFree(ctx, next_promise, JS_ATOM_then, 2,
                                (JSValueConst *)resolving_funcs);
            if (check_exception_free(ctx, ret))
                goto fail_reject1;
        }
    }
 done:
    JS_FreeValue(ctx, promise_resolve);
    JS_FreeValue(ctx, next_method);
    JS_FreeValue(ctx, iter);
    JS_FreeValue(ctx, resolving_funcs[0]);
    JS_FreeValue(ctx, resolving_funcs[1]);
    return result_promise;
 fail:
    //JS_FreeValue(ctx, next_method); // why not???
    JS_FreeValue(ctx, result_promise);
    result_promise = JS_EXCEPTION;
    goto done;
}